

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O1

void __thiscall
mjs::anon_unknown_33::define_own_property::anon_class_16_2_d5e5c5aa::operator()
          (anon_class_16_2_d5e5c5aa *this,char *name,value *v)

{
  bool bVar1;
  wostream *pwVar2;
  uint *puVar3;
  native_error_exception *this_00;
  global_object *this_01;
  wstring_view *s;
  wostringstream woss;
  wstring_view local_200;
  wstring local_1f0;
  wchar_t *local_1d0;
  uint *local_1c8;
  wstring_view local_1b0;
  wostringstream local_1a0 [376];
  
  if (v->type_ == undefined) {
    return;
  }
  if ((v->type_ == object) &&
     (bVar1 = gc_heap_ptr_untyped::has_type<mjs::function_object>
                        ((gc_heap_ptr_untyped *)&(v->field_1).s_), bVar1)) {
    return;
  }
  std::__cxx11::wostringstream::wostringstream(local_1a0);
  pwVar2 = std::operator<<((wostream *)local_1a0,name);
  pwVar2 = std::operator<<(pwVar2," for \"");
  puVar3 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this->p);
  local_1c8 = puVar3 + 1;
  local_1d0 = (wchar_t *)(ulong)*puVar3;
  cpp_quote_abi_cxx11_(&local_1f0,(mjs *)&local_1d0,s);
  pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (pwVar2,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  pwVar2 = std::operator<<(pwVar2,"\" must be a function: ");
  to_string((mjs *)&local_200,(this->global->super_gc_heap_ptr_untyped).heap_,v);
  mjs::operator<<(pwVar2,(string *)&local_200);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity * 4 + 4);
  }
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  this_01 = (global_object *)gc_heap_ptr_untyped::get(&this->global->super_gc_heap_ptr_untyped);
  global_object::stack_trace_abi_cxx11_(&local_1f0,this_01);
  local_200._M_len = local_1f0._M_string_length;
  local_200._M_str = local_1f0._M_dataplus._M_p;
  std::__cxx11::wstringbuf::str();
  local_1b0._M_len = (size_t)local_1c8;
  local_1b0._M_str = local_1d0;
  native_error_exception::native_error_exception(this_00,type,&local_200,&local_1b0);
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

void define_accessor_property(const gc_heap_ptr<global_object>& global, const object_ptr& o, const string& name, const value& get, const value& set, property_attribute attr) {
    assert(is_valid(attr) && !has_attributes(attr, property_attribute::accessor));
    o->define_accessor_property(name, make_accessor_object(global, get, set), attr);
}